

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getGOSTPublicKey(SoftHSM *this,GOSTPublicKey *publicKey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString local_a0;
  ByteString param;
  ByteString point;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || publicKey == (GOSTPublicKey *)0x0;
  if (key == (OSObject *)0x0 || (token == (Token *)0x0 || publicKey == (GOSTPublicKey *)0x0)) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&point);
  ByteString::ByteString(&param);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_a0,key,0x11);
    ByteString::operator=(&point,&local_a0);
    ByteString::~ByteString(&local_a0);
    (*key->_vptr_OSObject[6])(&local_a0,key,0x250);
    ByteString::operator=(&param,&local_a0);
    ByteString::~ByteString(&local_a0);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_a0,key,0x11);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a0,(uchar *)&point,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_a0);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_001482cd;
    (*key->_vptr_OSObject[6])(&local_a0,key,0x250);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a0,(uchar *)&param,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_a0);
    if ((char)iVar1 == '\0') goto LAB_001482cd;
  }
  (**(code **)(*(long *)publicKey + 0x30))(publicKey,&point);
  (**(code **)(*(long *)publicKey + 0x38))(publicKey,&param);
  CVar4 = 0;
LAB_001482cd:
  ByteString::~ByteString(&param);
  ByteString::~ByteString(&point);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getGOSTPublicKey(GOSTPublicKey* publicKey, Token* token, OSObject* key)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// GOST Public Key Attributes
	ByteString point;
	ByteString param;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_VALUE), point);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_GOSTR3410_PARAMS), param);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		point = key->getByteStringValue(CKA_VALUE);
		param = key->getByteStringValue(CKA_GOSTR3410_PARAMS);
	}

	publicKey->setQ(point);
	publicKey->setEC(param);

	return CKR_OK;
}